

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpull.c
# Opt level: O2

int nn_xpull_recv(nn_sockbase *self,nn_msg *msg)

{
  uint uVar1;
  
  uVar1 = nn_fq_recv((nn_fq *)(self + 1),msg,(nn_pipe **)0x0);
  return uVar1 & (int)uVar1 >> 0x1f;
}

Assistant:

static int nn_xpull_recv (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;

    rc = nn_fq_recv (&nn_cont (self, struct nn_xpull, sockbase)->fq,
         msg, NULL);

    /*  Discard NN_PIPEBASE_PARSED flag. */
    return rc < 0 ? rc : 0;
}